

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode easy_perform(Curl_easy *data,_Bool events)

{
  CURLcode local_d4;
  undefined1 local_d0 [8];
  sigpipe_ignore pipe_st;
  CURLcode result;
  CURLMcode mcode;
  Curl_multi *multi;
  _Bool events_local;
  Curl_easy *data_local;
  
  pipe_st.no_signal = false;
  pipe_st._153_3_ = 0;
  if (data == (Curl_easy *)0x0) {
    data_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    if ((data->set).errorbuffer != (char *)0x0) {
      *(data->set).errorbuffer = '\0';
    }
    if (data->multi == (Curl_multi *)0x0) {
      if (data->multi_easy == (Curl_multi *)0x0) {
        _result = Curl_multi_handle(1,3,7);
        if (_result == (Curl_multi *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        data->multi_easy = _result;
      }
      else {
        _result = data->multi_easy;
      }
      if ((_result->in_callback & 1U) == 0) {
        curl_multi_setopt(_result,CURLMOPT_MAXCONNECTS,(data->set).maxconnects);
        pipe_st._156_4_ = curl_multi_add_handle(_result,data);
        if (pipe_st._156_4_ == CURLM_OK) {
          sigpipe_ignore(data,(sigpipe_ignore *)local_d0);
          if (events) {
            local_d4 = CURLE_NOT_BUILT_IN;
          }
          else {
            local_d4 = easy_transfer(_result);
          }
          pipe_st._152_4_ = local_d4;
          curl_multi_remove_handle(_result,data);
          sigpipe_restore((sigpipe_ignore *)local_d0);
          data_local._4_4_ = pipe_st._152_4_;
        }
        else {
          curl_multi_cleanup(_result);
          data->multi_easy = (Curl_multi *)0x0;
          if (pipe_st._156_4_ == 3) {
            data_local._4_4_ = CURLE_OUT_OF_MEMORY;
          }
          else {
            data_local._4_4_ = CURLE_FAILED_INIT;
          }
        }
      }
      else {
        data_local._4_4_ = CURLE_RECURSIVE_API_CALL;
      }
    }
    else {
      Curl_failf(data,"easy handle already used in multi handle");
      data_local._4_4_ = CURLE_FAILED_INIT;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode easy_perform(struct Curl_easy *data, bool events)
{
  struct Curl_multi *multi;
  CURLMcode mcode;
  CURLcode result = CURLE_OK;
  SIGPIPE_VARIABLE(pipe_st);

  if(!data)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(data->set.errorbuffer)
    /* clear this as early as possible */
    data->set.errorbuffer[0] = 0;

  if(data->multi) {
    failf(data, "easy handle already used in multi handle");
    return CURLE_FAILED_INIT;
  }

  if(data->multi_easy)
    multi = data->multi_easy;
  else {
    /* this multi handle will only ever have a single easy handled attached
       to it, so make it use minimal hashes */
    multi = Curl_multi_handle(1, 3, 7);
    if(!multi)
      return CURLE_OUT_OF_MEMORY;
    data->multi_easy = multi;
  }

  if(multi->in_callback)
    return CURLE_RECURSIVE_API_CALL;

  /* Copy the MAXCONNECTS option to the multi handle */
  curl_multi_setopt(multi, CURLMOPT_MAXCONNECTS, data->set.maxconnects);

  mcode = curl_multi_add_handle(multi, data);
  if(mcode) {
    curl_multi_cleanup(multi);
    data->multi_easy = NULL;
    if(mcode == CURLM_OUT_OF_MEMORY)
      return CURLE_OUT_OF_MEMORY;
    return CURLE_FAILED_INIT;
  }

  sigpipe_ignore(data, &pipe_st);

  /* run the transfer */
  result = events ? easy_events(multi) : easy_transfer(multi);

  /* ignoring the return code isn't nice, but atm we can't really handle
     a failure here, room for future improvement! */
  (void)curl_multi_remove_handle(multi, data);

  sigpipe_restore(&pipe_st);

  /* The multi handle is kept alive, owned by the easy handle */
  return result;
}